

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_function_queue.h
# Opt level: O2

optional<double> __thiscall
density::
lf_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
::try_consume_impl(lf_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                   *this,lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                         *param_2)

{
  double dVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_double_()> *pFVar2;
  void *pvVar3;
  undefined8 extraout_RDX;
  optional<double> oVar4;
  consume_operation cons;
  consume_operation local_30;
  
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::try_start_consume(&local_30,param_2);
  if (local_30.m_consume_data.m_next_ptr < 0x10) {
    (this->m_queue).
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    .m_tail.super___atomic_base<unsigned_long>._M_i = 0;
    (this->m_queue).
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    .m_initial_page._M_b._M_p = (__pointer_type)0x0;
  }
  else {
    pFVar2 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::consume_operation::complete_type(&local_30);
    pvVar3 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
             ::consume_operation::unaligned_element_ptr(&local_30);
    dVar1 = (*pFVar2->m_align_invoke_destroy)(pvVar3);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::consume_operation::commit_nodestroy(&local_30);
    *(undefined1 *)
     &(this->m_queue).
      super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
      .
      super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
      .m_initial_page._M_b._M_p = 1;
    (this->m_queue).
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    .m_tail.super___atomic_base<unsigned_long>._M_i = (__int_type)dVar1;
  }
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::consume_operation::~consume_operation(&local_30);
  oVar4._8_8_ = extraout_RDX;
  oVar4.m_storage = (type)this;
  return oVar4;
}

Assistant:

optional<RET_VAL> try_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }